

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nacm.c
# Opt level: O2

LY_ERR nacm_parse(lysp_ctx *pctx,lysp_ext_instance *ext)

{
  ushort nodetype;
  void *pvVar1;
  lysp_ext_instance *plVar2;
  int iVar3;
  char *pcVar4;
  lysp_ext_instance *plVar5;
  lysp_ext_instance *plVar6;
  char *format;
  lysp_ext_instance *plVar7;
  char *__s;
  
  if ((short)ext->parent_stmt == 0) {
    __s = ext->name;
    pcVar4 = lyplg_ext_stmt2str(ext->parent_stmt);
    format = "Extension %s is allowed only in a data nodes, but it is placed in \"%s\" statement.";
  }
  else {
    __s = ext->name;
    pvVar1 = ext->parent;
    nodetype = *(ushort *)((long)pvVar1 + 8);
    if ((nodetype & 0x7ff) != 0) {
      pcVar4 = strchr(__s,0x3a);
      iVar3 = strcmp(pcVar4 + 1,"default-deny-write");
      if (((nodetype & 0x700) == 0) || (iVar3 != 0)) {
        plVar2 = *(lysp_ext_instance **)((long)pvVar1 + 0x38);
        plVar7 = (lysp_ext_instance *)0x0;
        plVar6 = plVar2;
        while( true ) {
          if (plVar2 == (lysp_ext_instance *)0x0) {
            plVar5 = (lysp_ext_instance *)0x0;
          }
          else {
            plVar5 = plVar2[-1].exts;
          }
          if (plVar5 <= plVar7) break;
          if (((plVar6 != ext) && (plVar6->record != (lyplg_ext_record *)0x0)) &&
             (iVar3 = strcmp((plVar6->record->plugin).id,(ext->record->plugin).id), iVar3 == 0)) {
            if (plVar6->name != __s) {
              lyplg_ext_parse_log(pctx,ext,LY_LLERR,LY_EVALID,
                                  "Extension nacm:default-deny-write is mixed with nacm:default-deny-all."
                                 );
              return LY_EVALID;
            }
            lyplg_ext_parse_log(pctx,ext,LY_LLERR,LY_EVALID,
                                "Extension %s is instantiated multiple times.",__s);
            return LY_EVALID;
          }
          plVar7 = (lysp_ext_instance *)((long)&plVar7->name + 1);
          plVar6 = plVar6 + 1;
        }
        return LY_SUCCESS;
      }
    }
    pcVar4 = lys_nodetype2str(nodetype);
    format = "Extension %s is not allowed in %s statement.";
  }
  lyplg_ext_parse_log(pctx,ext,LY_LLWRN,LY_SUCCESS,format,__s,pcVar4);
  return LY_ENOT;
}

Assistant:

static LY_ERR
nacm_parse(struct lysp_ctx *pctx, struct lysp_ext_instance *ext)
{
    struct lysp_node *parent = NULL;
    LY_ARRAY_COUNT_TYPE u;

    /* check that the extension is instantiated at an allowed place - data node */
    if (!(ext->parent_stmt & LY_STMT_NODE_MASK)) {
        lyplg_ext_parse_log(pctx, ext, LY_LLWRN, 0, "Extension %s is allowed only in a data nodes, but it is placed in "
                "\"%s\" statement.", ext->name, lyplg_ext_stmt2str(ext->parent_stmt));
        return LY_ENOT;
    }

    parent = ext->parent;
    if (!(parent->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_CHOICE | LYS_ANYDATA |
            LYS_CASE | LYS_RPC | LYS_ACTION | LYS_NOTIF)) || (!strcmp(strchr(ext->name, ':') + 1, "default-deny-write") &&
            (parent->nodetype & (LYS_RPC | LYS_ACTION | LYS_NOTIF)))) {
        /* note LYS_AUGMENT and LYS_USES is not in the list since they are not present in the compiled tree. Instead, libyang
         * passes all their extensions to their children nodes */
        lyplg_ext_parse_log(pctx, ext, LY_LLWRN, 0, "Extension %s is not allowed in %s statement.", ext->name,
                lys_nodetype2str(parent->nodetype));
        return LY_ENOT;
    }

    /* check for duplication */
    LY_ARRAY_FOR(parent->exts, u) {
        if ((&parent->exts[u] != ext) && parent->exts[u].record && !strcmp(parent->exts[u].record->plugin.id, ext->record->plugin.id)) {
            /* duplication of a NACM extension on a single node
             * We check for all NACM plugins since we want to catch even the situation that there is default-deny-all
             * AND default-deny-write */
            if (parent->exts[u].name == ext->name) {
                lyplg_ext_parse_log(pctx, ext, LY_LLERR, LY_EVALID, "Extension %s is instantiated multiple times.", ext->name);
            } else {
                lyplg_ext_parse_log(pctx, ext, LY_LLERR, LY_EVALID,
                        "Extension nacm:default-deny-write is mixed with nacm:default-deny-all.");
            }
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}